

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

Gia_Man_t * Gia_ManFormulaUnfold(Gia_Man_t *p,char *pForm,int fFfOnly)

{
  int iVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  Gia_Man_t *p_00;
  char *__dest;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int nPars;
  int iFans [2];
  int nVars;
  int iCtrl [8];
  char pStr [100];
  uint local_e4;
  ulong local_e0;
  int local_d4;
  uint local_d0;
  uint local_cc;
  Gia_Obj_t *local_c8;
  int local_bc;
  int local_b8 [8];
  char local_98 [104];
  
  local_d4 = fFfOnly;
  sVar5 = strlen(pForm);
  if (99 < sVar5) {
    __assert_fail("strlen(pForm) < 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x34d,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  Gia_FormStrCount(pForm,&local_bc,(int *)&local_e4);
  if (local_bc != 2) {
    __assert_fail("nVars == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x34f,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  Gia_FormStrTransform(local_98,pForm);
  Gia_ManPrintFormula(local_98);
  p_00 = Gia_ManStart(p->nObjs * 5);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(__s);
    __dest = (char *)malloc(sVar5 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar14 = 0;
    do {
      iVar10 = pVVar6->pArray[lVar14];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0058e116;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar8 = p_00->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) {
LAB_0058e0f7:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * -0x55555555);
      pGVar8 = p_00->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) goto LAB_0058e0f7;
      pGVar2[iVar10].Value = (int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar6 = p->vCis;
    } while (lVar14 < pVVar6->nSize);
  }
  uVar13 = local_e4;
  if (local_d4 == 0) {
    if (p->nObjs < 1) {
      local_e0 = 0;
    }
    else {
      uVar15 = (ulong)local_e4;
      local_e0 = 0;
      lVar14 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + lVar14;
        if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
          local_c8 = pGVar2;
          if (0 < (int)uVar13) {
            uVar11 = 0;
            do {
              pGVar8 = Gia_ManAppendObj(p_00);
              uVar3 = *(ulong *)pGVar8;
              *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
              *(ulong *)pGVar8 =
                   uVar3 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar2 = p_00->pObjs;
              if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) goto LAB_0058e0f7;
              Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555)
              ;
              pGVar2 = p_00->pObjs;
              if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) goto LAB_0058e0f7;
              local_b8[uVar11] = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556;
              uVar11 = uVar11 + 1;
            } while (uVar15 != uVar11);
          }
          pGVar2 = local_c8;
          if ((int)local_c8[-(ulong)((uint)*(ulong *)local_c8 & 0x1fffffff)].Value < 0)
          goto LAB_0058e135;
          local_d0 = (uint)*(ulong *)local_c8 >> 0x1d & 1 ^
                     local_c8[-(ulong)((uint)*(ulong *)local_c8 & 0x1fffffff)].Value;
          uVar12 = (uint)(*(ulong *)local_c8 >> 0x20);
          if ((int)local_c8[-(ulong)(uVar12 & 0x1fffffff)].Value < 0) goto LAB_0058e135;
          local_cc = uVar12 >> 0x1d & 1 ^ local_c8[-(ulong)(uVar12 & 0x1fffffff)].Value;
          sVar5 = strlen(local_98);
          uVar12 = Gia_ManRealizeFormula_rec
                             (p_00,(int *)&local_d0,local_b8,local_98,local_98 + sVar5,uVar13);
          pGVar2->Value = uVar12;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < p->nObjs);
    }
  }
  else {
    Gia_ManCleanMark0(p);
    uVar13 = local_e4;
    iVar10 = p->nRegs;
    if (0 < iVar10) {
      iVar4 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar12 = (iVar1 - iVar10) + iVar4;
        if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) goto LAB_0058e154;
        iVar10 = p->vCos->pArray[uVar12];
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0058e116;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + iVar10;
        *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) =
             *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) | 0x40000000;
        iVar4 = iVar4 + 1;
        iVar10 = p->nRegs;
      } while (iVar4 < iVar10);
    }
    if (p->nObjs < 1) {
      local_e0 = 0;
    }
    else {
      uVar15 = (ulong)local_e4;
      lVar14 = 0;
      local_e0 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + lVar14;
        uVar11 = *(ulong *)pGVar2;
        if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar11) {
          if (((uint)uVar11 >> 0x1e & 1) == 0) {
            if ((int)pGVar2[-(uVar11 & 0x1fffffff)].Value < 0) goto LAB_0058e135;
            uVar12 = (uint)(uVar11 >> 0x20);
            if ((int)pGVar2[-(ulong)(uVar12 & 0x1fffffff)].Value < 0) goto LAB_0058e135;
            uVar12 = Gia_ManHashAnd(p_00,pGVar2[-(uVar11 & 0x1fffffff)].Value ^
                                         (uint)(uVar11 >> 0x1d) & 7,
                                    pGVar2[-(ulong)(uVar12 & 0x1fffffff)].Value ^ uVar12 >> 0x1d & 1
                                   );
            pGVar2->Value = uVar12;
          }
          else {
            local_c8 = pGVar2;
            if (0 < (int)uVar13) {
              uVar11 = 0;
              do {
                pGVar8 = Gia_ManAppendObj(p_00);
                uVar3 = *(ulong *)pGVar8;
                *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
                *(ulong *)pGVar8 =
                     uVar3 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar2 = p_00->pObjs;
                if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) goto LAB_0058e0f7;
                Vec_IntPush(p_00->vCis,
                            (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
                pGVar2 = p_00->pObjs;
                if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) goto LAB_0058e0f7;
                local_b8[uVar11] = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556;
                uVar11 = uVar11 + 1;
              } while (uVar15 != uVar11);
            }
            if ((int)local_c8[-(ulong)((uint)*(ulong *)local_c8 & 0x1fffffff)].Value < 0)
            goto LAB_0058e135;
            local_d0 = (uint)*(ulong *)local_c8 >> 0x1d & 1 ^
                       local_c8[-(ulong)((uint)*(ulong *)local_c8 & 0x1fffffff)].Value;
            uVar12 = (uint)(*(ulong *)local_c8 >> 0x20);
            if ((int)local_c8[-(ulong)(uVar12 & 0x1fffffff)].Value < 0) goto LAB_0058e135;
            local_cc = uVar12 >> 0x1d & 1 ^ local_c8[-(ulong)(uVar12 & 0x1fffffff)].Value;
            sVar5 = strlen(local_98);
            uVar12 = Gia_ManRealizeFormula_rec
                               (p_00,(int *)&local_d0,local_b8,local_98,local_98 + sVar5,uVar13);
            local_c8->Value = uVar12;
            local_e0 = (ulong)((int)local_e0 + 1);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < p->nObjs);
    }
    iVar10 = p->nRegs;
    if (0 < iVar10) {
      iVar4 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar13 = (iVar1 - iVar10) + iVar4;
        if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) {
LAB_0058e154:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = p->vCos->pArray[uVar13];
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0058e116;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + iVar10;
        *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) =
             *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) &
             0xffffffffbfffffff;
        iVar4 = iVar4 + 1;
        iVar10 = p->nRegs;
      } while (iVar4 < iVar10);
    }
  }
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    lVar14 = 0;
    do {
      iVar10 = pVVar6->pArray[lVar14];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_0058e116:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar10;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_0058e135:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar13 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                    pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value
                              );
      pGVar2->Value = uVar13;
      lVar14 = lVar14 + 1;
      pVVar6 = p->vCos;
    } while (lVar14 < pVVar6->nSize);
  }
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar10 = p->vCis->nSize;
  iVar4 = (int)local_e0;
  if (local_d4 == 0) {
    iVar4 = ~(p->vCos->nSize + iVar10) + p->nObjs;
  }
  if (pGVar9->vCis->nSize - pGVar9->nRegs != iVar4 * local_e4 + iVar10) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + nPars * (fFfOnly ? Count : Gia_ManAndNum(p))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x37d,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManFormulaUnfold( Gia_Man_t * p, char * pForm, int fFfOnly )
{
    char pStr[100];
    int Count = 0;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, k, iCtrl[FFTEST_MAX_PARS], iFans[FFTEST_MAX_VARS];
    int nVars, nPars;
    assert( strlen(pForm) < 100 );
    Gia_FormStrCount( pForm, &nVars, &nPars );
    assert( nVars == 2 );
    Gia_FormStrTransform( pStr, pForm );
    Gia_ManPrintFormula( pStr );
    pNew = Gia_ManStart( 5 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    if ( fFfOnly )
    {
        Gia_ManCleanMark0( p );
        Gia_ManForEachRi( p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( pObj->fMark0 )
            {
                for ( k = 0; k < nPars; k++ )
                    iCtrl[k] = Gia_ManAppendCi(pNew);
                iFans[0] = Gia_ObjFanin0Copy(pObj);
                iFans[1] = Gia_ObjFanin1Copy(pObj);
                pObj->Value = Gia_ManRealizeFormula( pNew, iFans, iCtrl, pStr, nPars );
                Count++;
            }
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        Gia_ManForEachRi( p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 0;
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            for ( k = 0; k < nPars; k++ )
                iCtrl[k] = Gia_ManAppendCi(pNew);
            iFans[0] = Gia_ObjFanin0Copy(pObj);
            iFans[1] = Gia_ObjFanin1Copy(pObj);
            pObj->Value = Gia_ManRealizeFormula( pNew, iFans, iCtrl, pStr, nPars );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + nPars * (fFfOnly ? Count : Gia_ManAndNum(p)) );
//    if ( fUseFaults )
//        Gia_AigerWrite( pNew, "newfault.aig", 0, 0, 0 );
    return pNew;
}